

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set
          (ArenaStringPtr *this,string *default_value,string *value,Arena *arena)

{
  string *this_00;
  string *this_01;
  
  this_00 = (string *)(this->tagged_ptr_).ptr_;
  if (this_00 != default_value) {
    std::__cxx11::string::operator=((string *)this_00,(string *)value);
    return;
  }
  if (arena == (Arena *)0x0) {
    this_01 = (string *)operator_new(0x20);
  }
  else {
    ArenaImpl::RecordAlloc((ArenaImpl *)arena,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    this_01 = (string *)
              ArenaImpl::AllocateAlignedAndAddCleanup
                        ((ArenaImpl *)arena,0x20,arena_destruct_object<std::__cxx11::string>);
  }
  std::__cxx11::string::string(this_01,(string *)value);
  (this->tagged_ptr_).ptr_ = this_01;
  return;
}

Assistant:

void ArenaStringPtr::Set(const std::string* default_value, std::string&& value,
                         ::google::protobuf::Arena* arena) {
  if (IsDefault(default_value)) {
    if (arena == nullptr) {
      tagged_ptr_.Set(new std::string(std::move(value)));
    } else {
      tagged_ptr_.Set(Arena::Create<std::string>(arena, std::move(value)));
    }
  } else if (IsDonatedString()) {
    std::string* current = tagged_ptr_.Get();
    auto* s = new (current) std::string(std::move(value));
    arena->OwnDestructor(s);
    tagged_ptr_.Set(s);
  } else /* !IsDonatedString() */ {
    *UnsafeMutablePointer() = std::move(value);
  }
}